

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O1

void InitPalette(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong in_R9;
  int iVar6;
  int iVar7;
  FWadLump palump;
  BYTE pal [768];
  FWadLump local_350;
  BYTE local_318 [768];
  
  iVar2 = FWadCollection::CheckNumForFullName(&Wads,"palette.dat",false,0);
  if ((iVar2 < 0) || (iVar3 = FWadCollection::LumpLength(&Wads,iVar2), iVar3 < 0x300)) {
    bVar1 = false;
    iVar2 = FWadCollection::CheckNumForFullName(&Wads,"blood.pal",false,0);
    if (iVar2 < 0) goto LAB_00494455;
    iVar3 = FWadCollection::LumpLength(&Wads,iVar2);
    if (iVar3 < 0x300) {
      bVar1 = false;
      goto LAB_00494455;
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  bVar1 = FixBuildPalette(local_318,iVar2,bVar1);
LAB_00494455:
  if (bVar1 == false) {
    iVar2 = FWadCollection::GetNumForName(&Wads,"PLAYPAL",0);
    FWadCollection::OpenLumpNum(&local_350,&Wads,iVar2);
    FWadLump::Read(&local_350,local_318,0x300);
    FWadLump::~FWadLump(&local_350);
  }
  FPalette::SetPalette(&GPalette,local_318);
  FPalette::MakeGoodRemap(&GPalette);
  FColorMatcher::SetPalette(&ColorMatcher,(DWORD *)&GPalette);
  if (bVar1 == false && GPalette.Remap[0] == '\0') {
    iVar2 = 0x30603;
    uVar4 = 1;
    uVar5 = 1;
    do {
      iVar3 = (uint)GPalette.BaseColors[0].field_0.field_0.r -
              (uint)GPalette.BaseColors[uVar5].field_0.field_0.r;
      iVar7 = (uint)GPalette.BaseColors[0].field_0.field_0.g -
              (uint)GPalette.BaseColors[uVar5].field_0.field_0.g;
      iVar6 = (uint)GPalette.BaseColors[0].field_0.field_0.b -
              (uint)GPalette.BaseColors[uVar5].field_0.field_0.b;
      iVar3 = iVar6 * iVar6 + iVar7 * iVar7 + iVar3 * iVar3;
      bVar1 = true;
      if (iVar3 < iVar2) {
        if (iVar3 == 0) {
          bVar1 = false;
          in_R9 = uVar5 & 0xffffffff;
        }
        else {
          uVar4 = uVar5 & 0xffffffff;
          iVar2 = iVar3;
        }
      }
      GPalette.Remap[0] = (BYTE)uVar4;
      if (!bVar1) {
        GPalette.Remap[0] = (BYTE)in_R9;
        break;
      }
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 != 0xff);
  }
  R_InitColormaps();
  return;
}

Assistant:

void InitPalette ()
{
	BYTE pal[768];
	bool usingBuild = false;
	int lump;

	if ((lump = Wads.CheckNumForFullName ("palette.dat")) >= 0 && Wads.LumpLength (lump) >= 768)
	{
		usingBuild = FixBuildPalette (pal, lump, false);
	}
	else if ((lump = Wads.CheckNumForFullName ("blood.pal")) >= 0 && Wads.LumpLength (lump) >= 768)
	{
		usingBuild = FixBuildPalette (pal, lump, true);
	}

	if (!usingBuild)
	{
		FWadLump palump = Wads.OpenLumpName ("PLAYPAL");
		palump.Read (pal, 768);
	}

	GPalette.SetPalette (pal);
	GPalette.MakeGoodRemap ();
	ColorMatcher.SetPalette ((DWORD *)GPalette.BaseColors);

	// The BUILD engine already has a transparent color, so it doesn't need any remapping.
	if (!usingBuild)
	{
		if (GPalette.Remap[0] == 0)
		{ // No duplicates, so settle for something close to color 0
			GPalette.Remap[0] = BestColor ((DWORD *)GPalette.BaseColors,
				GPalette.BaseColors[0].r, GPalette.BaseColors[0].g, GPalette.BaseColors[0].b, 1, 255);
		}
	}

	// Colormaps have to be initialized before actors are loaded,
	// otherwise Powerup.Colormap will not work.
	R_InitColormaps ();
}